

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void google::protobuf::anon_unknown_6::AssignDescriptorsImpl(DescriptorTable *table,bool eager)

{
  bool bVar1;
  int iVar2;
  DescriptorPool *this;
  LogMessage *pLVar3;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  FileOptions *this_00;
  ServiceDescriptor *pSVar4;
  int local_a4;
  int local_a0;
  int i_3;
  int i_2;
  int i_1;
  AssignDescriptorsHelper helper;
  MessageFactory *factory;
  LogMessage local_50;
  Voidify local_39;
  string_view local_38;
  FileDescriptor *local_28;
  FileDescriptor *file;
  int local_18;
  int i;
  int num_deps;
  bool eager_local;
  DescriptorTable *table_local;
  
  i._3_1_ = eager;
  _num_deps = table;
  if ((protobuf::(anonymous_namespace)::
       AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)::mu == '\0')
     && (iVar2 = __cxa_guard_acquire(&protobuf::(anonymous_namespace)::
                                      AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)
                                      ::mu), iVar2 != 0)) {
    __cxa_atexit(absl::lts_20250127::Mutex::~Mutex,&AssignDescriptorsImpl::mu,&__dso_handle);
    __cxa_guard_release(&protobuf::(anonymous_namespace)::
                         AssignDescriptorsImpl(google::protobuf::internal::DescriptorTable_const*,bool)
                         ::mu);
  }
  absl::lts_20250127::Mutex::Lock(&AssignDescriptorsImpl::mu);
  internal::AddDescriptors(_num_deps);
  absl::lts_20250127::Mutex::Unlock(&AssignDescriptorsImpl::mu);
  if ((i._3_1_ & 1) != 0) {
    local_18 = _num_deps->num_deps;
    for (file._4_4_ = 0; file._4_4_ < local_18; file._4_4_ = file._4_4_ + 1) {
      if (_num_deps->deps[file._4_4_] != (DescriptorTable *)0x0) {
        file._3_1_ = 1;
        absl::lts_20250127::
        call_once<void(&)(google::protobuf::internal::DescriptorTable_const*,bool),google::protobuf::internal::DescriptorTable_const*const&,bool>
                  (_num_deps->deps[file._4_4_]->once,AssignDescriptorsImpl,
                   _num_deps->deps + file._4_4_,(bool *)((long)&file + 3));
      }
    }
  }
  this = DescriptorPool::internal_generated_pool();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,_num_deps->filename);
  local_28 = DescriptorPool::FindFileByName(this,local_38);
  if (local_28 == (FileDescriptor *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0xf14,"file != nullptr");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  helper.offsets_ = (uint32_t *)MessageFactory::generated_factory();
  AssignDescriptorsHelper::AssignDescriptorsHelper
            ((AssignDescriptorsHelper *)&i_2,(MessageFactory *)helper.offsets_,
             _num_deps->file_level_enum_descriptors,_num_deps->schemas,_num_deps->default_instances,
             _num_deps->offsets);
  for (i_3 = 0; iVar2 = FileDescriptor::message_type_count(local_28), i_3 < iVar2; i_3 = i_3 + 1) {
    descriptor = FileDescriptor::message_type(local_28,i_3);
    AssignDescriptorsHelper::AssignMessageDescriptor((AssignDescriptorsHelper *)&i_2,descriptor);
  }
  for (local_a0 = 0; iVar2 = FileDescriptor::enum_type_count(local_28), local_a0 < iVar2;
      local_a0 = local_a0 + 1) {
    descriptor_00 = FileDescriptor::enum_type(local_28,local_a0);
    AssignDescriptorsHelper::AssignEnumDescriptor((AssignDescriptorsHelper *)&i_2,descriptor_00);
  }
  this_00 = FileDescriptor::options(local_28);
  bVar1 = FileOptions::cc_generic_services(this_00);
  if (bVar1) {
    for (local_a4 = 0; iVar2 = FileDescriptor::service_count(local_28), local_a4 < iVar2;
        local_a4 = local_a4 + 1) {
      pSVar4 = FileDescriptor::service(local_28,local_a4);
      _num_deps->file_level_service_descriptors[local_a4] = pSVar4;
    }
  }
  return;
}

Assistant:

void AssignDescriptorsImpl(const DescriptorTable* table, bool eager) {
  // Ensure the file descriptor is added to the pool.
  {
    // This only happens once per proto file. So a global mutex to serialize
    // calls to AddDescriptors.
    static absl::Mutex mu{absl::kConstInit};
    mu.Lock();
    AddDescriptors(table);
    mu.Unlock();
  }
  if (eager) {
    // Normally we do not want to eagerly build descriptors of our deps.
    // However if this proto is optimized for code size (ie using reflection)
    // and it has a message extending a custom option of a descriptor with that
    // message being optimized for code size as well. Building the descriptors
    // in this file requires parsing the serialized file descriptor, which now
    // requires parsing the message extension, which potentially requires
    // building the descriptor of the message extending one of the options.
    // However we are already updating descriptor pool under a lock. To prevent
    // this the compiler statically looks for this case and we just make sure we
    // first build the descriptors of all our dependencies, preventing the
    // deadlock.
    int num_deps = table->num_deps;
    for (int i = 0; i < num_deps; i++) {
      // In case of weak fields deps[i] could be null.
      if (table->deps[i]) {
        absl::call_once(*table->deps[i]->once, AssignDescriptorsImpl,
                        table->deps[i],
                        /*eager=*/true);
      }
    }
  }

  // Fill the arrays with pointers to descriptors and reflection classes.
  const FileDescriptor* file =
      DescriptorPool::internal_generated_pool()->FindFileByName(
          table->filename);
  ABSL_CHECK(file != nullptr);

  MessageFactory* factory = MessageFactory::generated_factory();

  AssignDescriptorsHelper helper(factory, table->file_level_enum_descriptors,
                                 table->schemas, table->default_instances,
                                 table->offsets);

  for (int i = 0; i < file->message_type_count(); i++) {
    helper.AssignMessageDescriptor(file->message_type(i));
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    helper.AssignEnumDescriptor(file->enum_type(i));
  }
  if (file->options().cc_generic_services()) {
    for (int i = 0; i < file->service_count(); i++) {
      table->file_level_service_descriptors[i] = file->service(i);
    }
  }
}